

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbePmaReaderIncrMergeInit(PmaReader *pReadr,int eMode)

{
  IncrMerger *pIncr;
  SortSubtask *pTask;
  sqlite3 *db;
  long lVar1;
  int iVar2;
  long nExtend;
  
  pIncr = pReadr->pIncr;
  pTask = pIncr->pTask;
  db = pTask->pSorter->db;
  iVar2 = vdbeMergeEngineInit(pTask,pIncr->pMerger,eMode);
  if (iVar2 == 0) {
    nExtend = (long)pIncr->mxSz;
    if (pIncr->bUseThread == 0) {
      iVar2 = 0;
      if ((pTask->file2).pFd == (sqlite3_file *)0x0) {
        iVar2 = vdbeSorterOpenTempFile(db,(pTask->file2).iEof,&(pTask->file2).pFd);
        (pTask->file2).iEof = 0;
      }
      if (iVar2 == 0) {
        pIncr->aFile[1].pFd = (pTask->file2).pFd;
        lVar1 = (pTask->file2).iEof;
        pIncr->iStartOff = lVar1;
        (pTask->file2).iEof = nExtend + lVar1;
        iVar2 = 0;
      }
    }
    else {
      iVar2 = vdbeSorterOpenTempFile(db,nExtend,&pIncr->aFile[0].pFd);
      if (iVar2 == 0) {
        iVar2 = vdbeSorterOpenTempFile(db,nExtend,&pIncr->aFile[1].pFd);
      }
    }
  }
  if (iVar2 == 0) {
    if (pIncr->bUseThread == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = vdbeIncrPopulate(pIncr);
    }
  }
  if ((eMode != 1) && (iVar2 == 0)) {
    iVar2 = vdbePmaReaderNext(pReadr);
    return iVar2;
  }
  return iVar2;
}

Assistant:

static int vdbePmaReaderIncrMergeInit(PmaReader *pReadr, int eMode){
  int rc = SQLITE_OK;
  IncrMerger *pIncr = pReadr->pIncr;
  SortSubtask *pTask = pIncr->pTask;
  sqlite3 *db = pTask->pSorter->db;

  /* eMode is always INCRINIT_NORMAL in single-threaded mode */
  assert( SQLITE_MAX_WORKER_THREADS>0 || eMode==INCRINIT_NORMAL );

  rc = vdbeMergeEngineInit(pTask, pIncr->pMerger, eMode);

  /* Set up the required files for pIncr. A multi-threaded IncrMerge object
  ** requires two temp files to itself, whereas a single-threaded object
  ** only requires a region of pTask->file2. */
  if( rc==SQLITE_OK ){
    int mxSz = pIncr->mxSz;
#if SQLITE_MAX_WORKER_THREADS>0
    if( pIncr->bUseThread ){
      rc = vdbeSorterOpenTempFile(db, mxSz, &pIncr->aFile[0].pFd);
      if( rc==SQLITE_OK ){
        rc = vdbeSorterOpenTempFile(db, mxSz, &pIncr->aFile[1].pFd);
      }
    }else
#endif
    /*if( !pIncr->bUseThread )*/{
      if( pTask->file2.pFd==0 ){
        assert( pTask->file2.iEof>0 );
        rc = vdbeSorterOpenTempFile(db, pTask->file2.iEof, &pTask->file2.pFd);
        pTask->file2.iEof = 0;
      }
      if( rc==SQLITE_OK ){
        pIncr->aFile[1].pFd = pTask->file2.pFd;
        pIncr->iStartOff = pTask->file2.iEof;
        pTask->file2.iEof += mxSz;
      }
    }
  }

#if SQLITE_MAX_WORKER_THREADS>0
  if( rc==SQLITE_OK && pIncr->bUseThread ){
    /* Use the current thread to populate aFile[1], even though this
    ** PmaReader is multi-threaded. If this is an INCRINIT_TASK object,
    ** then this function is already running in background thread
    ** pIncr->pTask->thread.
    **
    ** If this is the INCRINIT_ROOT object, then it is running in the
    ** main VDBE thread. But that is Ok, as that thread cannot return
    ** control to the VDBE or proceed with anything useful until the
    ** first results are ready from this merger object anyway.
    */
    assert( eMode==INCRINIT_ROOT || eMode==INCRINIT_TASK );
    rc = vdbeIncrPopulate(pIncr);
  }
#endif

  if( rc==SQLITE_OK && (SQLITE_MAX_WORKER_THREADS==0 || eMode!=INCRINIT_TASK) ){
    rc = vdbePmaReaderNext(pReadr);
  }

  return rc;
}